

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O2

void jpeg_idct_13x13(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  JSAMPLE *pJVar5;
  void *pvVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  int iVar34;
  long lVar35;
  int iVar36;
  long lVar37;
  int iVar38;
  int iVar39;
  long lVar40;
  int iVar41;
  long lVar42;
  int iVar43;
  long lVar44;
  int aiStack_1d8 [106];
  
  pJVar5 = cinfo->sample_range_limit;
  pvVar6 = compptr->dct_table;
  for (lVar25 = 0; (int)lVar25 != 8; lVar25 = lVar25 + 1) {
    lVar8 = (long)*(short *)((long)pvVar6 + lVar25 * 2) * (long)coef_block[lVar25] * 0x2000;
    lVar11 = (long)*(short *)((long)pvVar6 + lVar25 * 2 + 0x20) * (long)coef_block[lVar25 + 0x10];
    lVar13 = (long)*(short *)((long)pvVar6 + lVar25 * 2 + 0x40) * (long)coef_block[lVar25 + 0x20];
    lVar27 = (long)*(short *)((long)pvVar6 + lVar25 * 2 + 0x60) * (long)coef_block[lVar25 + 0x30];
    lVar14 = lVar27 + lVar13;
    lVar13 = lVar13 - lVar27;
    lVar30 = lVar13 * 0x319 + lVar8 + 0x400;
    lVar44 = lVar11 * 0x2bf1 + lVar14 * 0x24f9 + lVar30;
    lVar30 = lVar11 * 0x100c + lVar14 * -0x24f9 + lVar30;
    lVar32 = lVar13 * 0xf95 + lVar8 + 0x400;
    lVar37 = lVar11 * 0x21e0 + lVar14 * -0xa20 + lVar32;
    lVar32 = lVar11 * -0x2812 + lVar14 * 0xa20 + lVar32;
    lVar28 = lVar13 * -0x1dfe + lVar8 + 0x400;
    lVar42 = lVar11 * -0x574 + lVar14 * -0xdf2 + lVar28;
    lVar28 = lVar11 * -0x19b5 + lVar14 * 0xdf2 + lVar28;
    lVar22 = (long)*(short *)((long)pvVar6 + lVar25 * 2 + 0x10) * (long)coef_block[lVar25 + 8];
    lVar19 = (long)*(short *)((long)pvVar6 + lVar25 * 2 + 0x30) * (long)coef_block[lVar25 + 0x18];
    lVar29 = (long)*(short *)((long)pvVar6 + lVar25 * 2 + 0x50) * (long)coef_block[lVar25 + 0x28];
    lVar33 = (long)*(short *)((long)pvVar6 + lVar25 * 2 + 0x70) * (long)coef_block[lVar25 + 0x38];
    lVar14 = (lVar22 + lVar19) * 0x2a50;
    lVar40 = (lVar29 + lVar22) * 0x253e;
    lVar35 = (lVar33 + lVar22) * 0x1e02;
    lVar27 = lVar22 * -0x40a5 + lVar14 + lVar40 + lVar35;
    lVar15 = (lVar29 + lVar19) * -0xad5;
    lVar17 = (lVar33 + lVar19) * -0x253e;
    lVar16 = lVar15 + lVar17 + lVar19 * 0x1acb + lVar14;
    lVar14 = (lVar33 + lVar29) * -0x1508;
    lVar40 = lVar40 + lVar14 + lVar29 * -0x324f + lVar15;
    lVar17 = lVar35 + lVar14 + lVar33 * 0x4694 + lVar17;
    lVar15 = (lVar29 - lVar19) * 0x1e02 + (lVar33 + lVar22) * 0xad5;
    lVar14 = lVar19 * -0xeea + lVar22 * 0xa33 + lVar15;
    lVar15 = lVar33 * -0x37c1 + lVar29 * 0xc4e + lVar15;
    aiStack_1d8[lVar25] = (int)((ulong)(lVar27 + lVar44) >> 0xb);
    aiStack_1d8[lVar25 + 0x60] = (int)((ulong)(lVar44 - lVar27) >> 0xb);
    aiStack_1d8[lVar25 + 8] = (int)((ulong)(lVar16 + lVar37) >> 0xb);
    aiStack_1d8[lVar25 + 0x58] = (int)((ulong)(lVar37 - lVar16) >> 0xb);
    aiStack_1d8[lVar25 + 0x10] = (int)((ulong)(lVar30 + lVar40) >> 0xb);
    aiStack_1d8[lVar25 + 0x50] = (int)((ulong)(lVar30 - lVar40) >> 0xb);
    aiStack_1d8[lVar25 + 0x18] = (int)((ulong)(lVar17 + lVar42) >> 0xb);
    aiStack_1d8[lVar25 + 0x48] = (int)((ulong)(lVar42 - lVar17) >> 0xb);
    aiStack_1d8[lVar25 + 0x20] = (int)((ulong)(lVar14 + lVar28) >> 0xb);
    aiStack_1d8[lVar25 + 0x40] = (int)((ulong)(lVar28 - lVar14) >> 0xb);
    aiStack_1d8[lVar25 + 0x28] = (int)((ulong)(lVar32 + lVar15) >> 0xb);
    aiStack_1d8[lVar25 + 0x38] = (int)((ulong)(lVar32 - lVar15) >> 0xb);
    aiStack_1d8[lVar25 + 0x30] = (int)(lVar8 + (lVar13 - lVar11) * 0x2d41 + 0x400U >> 0xb);
  }
  uVar9 = (ulong)output_col;
  for (lVar25 = 0; lVar25 != 0x68; lVar25 = lVar25 + 8) {
    iVar1 = aiStack_1d8[lVar25 + 1];
    iVar7 = aiStack_1d8[lVar25] * 0x2000;
    iVar2 = aiStack_1d8[lVar25 + 2];
    iVar24 = aiStack_1d8[lVar25 + 6] + aiStack_1d8[lVar25 + 4];
    iVar12 = aiStack_1d8[lVar25 + 4] - aiStack_1d8[lVar25 + 6];
    iVar26 = iVar12 * 0x319 + iVar7 + 0x20000;
    iVar34 = iVar2 * 0x2bf1 + iVar24 * 0x24f9 + iVar26;
    iVar26 = iVar2 * 0x100c + iVar24 * -0x24f9 + iVar26;
    iVar31 = iVar12 * 0xf95 + iVar7 + 0x20000;
    iVar43 = iVar2 * 0x21e0 + iVar24 * -0xa20 + iVar31;
    iVar31 = iVar2 * -0x2812 + iVar24 * 0xa20 + iVar31;
    iVar23 = iVar12 * -0x1dfe + iVar7 + 0x20000;
    iVar41 = iVar2 * -0x574 + iVar24 * -0xdf2 + iVar23;
    iVar23 = iVar2 * -0x19b5 + iVar24 * 0xdf2 + iVar23;
    iVar24 = aiStack_1d8[lVar25 + 3];
    iVar3 = aiStack_1d8[lVar25 + 5];
    iVar4 = aiStack_1d8[lVar25 + 7];
    iVar20 = (iVar24 + iVar1) * 0x2a50;
    iVar18 = (iVar3 + iVar1) * 0x253e;
    iVar36 = (iVar4 + iVar1) * 0x1e02;
    iVar10 = iVar1 * -0x40a5 + iVar20 + iVar18 + iVar36;
    iVar21 = (iVar3 + iVar24) * -0xad5;
    iVar38 = (iVar4 + iVar24) * -0x253e;
    iVar20 = iVar21 + iVar38 + iVar24 * 0x1acb + iVar20;
    iVar39 = (iVar4 + iVar3) * -0x1508;
    iVar18 = iVar18 + iVar39 + iVar3 * -0x324f + iVar21;
    iVar36 = iVar36 + iVar39 + iVar4 * 0x4694 + iVar38;
    iVar21 = (iVar3 - iVar24) * 0x1e02 + (iVar4 + iVar1) * 0xad5;
    iVar24 = iVar24 * -0xeea + iVar1 * 0xa33 + iVar21;
    iVar21 = iVar4 * -0x37c1 + iVar3 * 0xc4e + iVar21;
    lVar14 = *(long *)((long)output_buf + lVar25);
    *(JSAMPLE *)(lVar14 + uVar9) = pJVar5[(ulong)((uint)(iVar10 + iVar34) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar14 + 0xc + uVar9) =
         pJVar5[(ulong)((uint)(iVar34 - iVar10) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar14 + 1 + uVar9) =
         pJVar5[(ulong)((uint)(iVar20 + iVar43) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar14 + 0xb + uVar9) =
         pJVar5[(ulong)((uint)(iVar43 - iVar20) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar14 + 2 + uVar9) =
         pJVar5[(ulong)((uint)(iVar26 + iVar18) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar14 + 10 + uVar9) =
         pJVar5[(ulong)((uint)(iVar26 - iVar18) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar14 + 3 + uVar9) =
         pJVar5[(ulong)((uint)(iVar36 + iVar41) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar14 + 9 + uVar9) =
         pJVar5[(ulong)((uint)(iVar41 - iVar36) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar14 + 4 + uVar9) =
         pJVar5[(ulong)((uint)(iVar24 + iVar23) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar14 + 8 + uVar9) =
         pJVar5[(ulong)((uint)(iVar23 - iVar24) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar14 + 5 + uVar9) =
         pJVar5[(ulong)((uint)(iVar21 + iVar31) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar14 + 7 + uVar9) =
         pJVar5[(ulong)((uint)(iVar31 - iVar21) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar14 + 6 + uVar9) =
         pJVar5[(ulong)(iVar7 + (iVar12 - iVar2) * 0x2d41 + 0x20000U >> 0x12 & 0x3ff) + 0x80];
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_13x13(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  JLONG tmp10, tmp11, tmp12, tmp13, tmp14, tmp15;
  JLONG tmp20, tmp21, tmp22, tmp23, tmp24, tmp25, tmp26;
  JLONG z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[8 * 13];        /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 8; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    z1 = LEFT_SHIFT(z1, CONST_BITS);
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS - PASS1_BITS - 1);

    z2 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);

    tmp10 = z3 + z4;
    tmp11 = z3 - z4;

    tmp12 = MULTIPLY(tmp10, FIX(1.155388986));                /* (c4+c6)/2 */
    tmp13 = MULTIPLY(tmp11, FIX(0.096834934)) + z1;           /* (c4-c6)/2 */

    tmp20 = MULTIPLY(z2, FIX(1.373119086)) + tmp12 + tmp13;   /* c2 */
    tmp22 = MULTIPLY(z2, FIX(0.501487041)) - tmp12 + tmp13;   /* c10 */

    tmp12 = MULTIPLY(tmp10, FIX(0.316450131));                /* (c8-c12)/2 */
    tmp13 = MULTIPLY(tmp11, FIX(0.486914739)) + z1;           /* (c8+c12)/2 */

    tmp21 = MULTIPLY(z2, FIX(1.058554052)) - tmp12 + tmp13;   /* c6 */
    tmp25 = MULTIPLY(z2, -FIX(1.252223920)) + tmp12 + tmp13;  /* c4 */

    tmp12 = MULTIPLY(tmp10, FIX(0.435816023));                /* (c2-c10)/2 */
    tmp13 = MULTIPLY(tmp11, FIX(0.937303064)) - z1;           /* (c2+c10)/2 */

    tmp23 = MULTIPLY(z2, -FIX(0.170464608)) - tmp12 - tmp13;  /* c12 */
    tmp24 = MULTIPLY(z2, -FIX(0.803364869)) + tmp12 - tmp13;  /* c8 */

    tmp26 = MULTIPLY(tmp11 - z2, FIX(1.414213562)) + z1;      /* c0 */

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);

    tmp11 = MULTIPLY(z1 + z2, FIX(1.322312651));     /* c3 */
    tmp12 = MULTIPLY(z1 + z3, FIX(1.163874945));     /* c5 */
    tmp15 = z1 + z4;
    tmp13 = MULTIPLY(tmp15, FIX(0.937797057));       /* c7 */
    tmp10 = tmp11 + tmp12 + tmp13 -
            MULTIPLY(z1, FIX(2.020082300));          /* c7+c5+c3-c1 */
    tmp14 = MULTIPLY(z2 + z3, -FIX(0.338443458));    /* -c11 */
    tmp11 += tmp14 + MULTIPLY(z2, FIX(0.837223564)); /* c5+c9+c11-c3 */
    tmp12 += tmp14 - MULTIPLY(z3, FIX(1.572116027)); /* c1+c5-c9-c11 */
    tmp14 = MULTIPLY(z2 + z4, -FIX(1.163874945));    /* -c5 */
    tmp11 += tmp14;
    tmp13 += tmp14 + MULTIPLY(z4, FIX(2.205608352)); /* c3+c5+c9-c7 */
    tmp14 = MULTIPLY(z3 + z4, -FIX(0.657217813));    /* -c9 */
    tmp12 += tmp14;
    tmp13 += tmp14;
    tmp15 = MULTIPLY(tmp15, FIX(0.338443458));       /* c11 */
    tmp14 = tmp15 + MULTIPLY(z1, FIX(0.318774355)) - /* c9-c11 */
            MULTIPLY(z2, FIX(0.466105296));          /* c1-c7 */
    z1    = MULTIPLY(z3 - z2, FIX(0.937797057));     /* c7 */
    tmp14 += z1;
    tmp15 += z1 + MULTIPLY(z3, FIX(0.384515595)) -   /* c3-c7 */
             MULTIPLY(z4, FIX(1.742345811));         /* c1+c11 */

    /* Final output stage */

    wsptr[8 * 0]  = (int)RIGHT_SHIFT(tmp20 + tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 12] = (int)RIGHT_SHIFT(tmp20 - tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 1]  = (int)RIGHT_SHIFT(tmp21 + tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 11] = (int)RIGHT_SHIFT(tmp21 - tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 2]  = (int)RIGHT_SHIFT(tmp22 + tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 10] = (int)RIGHT_SHIFT(tmp22 - tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 3]  = (int)RIGHT_SHIFT(tmp23 + tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 9]  = (int)RIGHT_SHIFT(tmp23 - tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 4]  = (int)RIGHT_SHIFT(tmp24 + tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 8]  = (int)RIGHT_SHIFT(tmp24 - tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 5]  = (int)RIGHT_SHIFT(tmp25 + tmp15, CONST_BITS - PASS1_BITS);
    wsptr[8 * 7]  = (int)RIGHT_SHIFT(tmp25 - tmp15, CONST_BITS - PASS1_BITS);
    wsptr[8 * 6]  = (int)RIGHT_SHIFT(tmp26, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 13 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 13; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    z1 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    z1 = LEFT_SHIFT(z1, CONST_BITS);

    z2 = (JLONG)wsptr[2];
    z3 = (JLONG)wsptr[4];
    z4 = (JLONG)wsptr[6];

    tmp10 = z3 + z4;
    tmp11 = z3 - z4;

    tmp12 = MULTIPLY(tmp10, FIX(1.155388986));                /* (c4+c6)/2 */
    tmp13 = MULTIPLY(tmp11, FIX(0.096834934)) + z1;           /* (c4-c6)/2 */

    tmp20 = MULTIPLY(z2, FIX(1.373119086)) + tmp12 + tmp13;   /* c2 */
    tmp22 = MULTIPLY(z2, FIX(0.501487041)) - tmp12 + tmp13;   /* c10 */

    tmp12 = MULTIPLY(tmp10, FIX(0.316450131));                /* (c8-c12)/2 */
    tmp13 = MULTIPLY(tmp11, FIX(0.486914739)) + z1;           /* (c8+c12)/2 */

    tmp21 = MULTIPLY(z2, FIX(1.058554052)) - tmp12 + tmp13;   /* c6 */
    tmp25 = MULTIPLY(z2, -FIX(1.252223920)) + tmp12 + tmp13;  /* c4 */

    tmp12 = MULTIPLY(tmp10, FIX(0.435816023));                /* (c2-c10)/2 */
    tmp13 = MULTIPLY(tmp11, FIX(0.937303064)) - z1;           /* (c2+c10)/2 */

    tmp23 = MULTIPLY(z2, -FIX(0.170464608)) - tmp12 - tmp13;  /* c12 */
    tmp24 = MULTIPLY(z2, -FIX(0.803364869)) + tmp12 - tmp13;  /* c8 */

    tmp26 = MULTIPLY(tmp11 - z2, FIX(1.414213562)) + z1;      /* c0 */

    /* Odd part */

    z1 = (JLONG)wsptr[1];
    z2 = (JLONG)wsptr[3];
    z3 = (JLONG)wsptr[5];
    z4 = (JLONG)wsptr[7];

    tmp11 = MULTIPLY(z1 + z2, FIX(1.322312651));     /* c3 */
    tmp12 = MULTIPLY(z1 + z3, FIX(1.163874945));     /* c5 */
    tmp15 = z1 + z4;
    tmp13 = MULTIPLY(tmp15, FIX(0.937797057));       /* c7 */
    tmp10 = tmp11 + tmp12 + tmp13 -
            MULTIPLY(z1, FIX(2.020082300));          /* c7+c5+c3-c1 */
    tmp14 = MULTIPLY(z2 + z3, -FIX(0.338443458));    /* -c11 */
    tmp11 += tmp14 + MULTIPLY(z2, FIX(0.837223564)); /* c5+c9+c11-c3 */
    tmp12 += tmp14 - MULTIPLY(z3, FIX(1.572116027)); /* c1+c5-c9-c11 */
    tmp14 = MULTIPLY(z2 + z4, -FIX(1.163874945));    /* -c5 */
    tmp11 += tmp14;
    tmp13 += tmp14 + MULTIPLY(z4, FIX(2.205608352)); /* c3+c5+c9-c7 */
    tmp14 = MULTIPLY(z3 + z4, -FIX(0.657217813));    /* -c9 */
    tmp12 += tmp14;
    tmp13 += tmp14;
    tmp15 = MULTIPLY(tmp15, FIX(0.338443458));       /* c11 */
    tmp14 = tmp15 + MULTIPLY(z1, FIX(0.318774355)) - /* c9-c11 */
            MULTIPLY(z2, FIX(0.466105296));          /* c1-c7 */
    z1    = MULTIPLY(z3 - z2, FIX(0.937797057));     /* c7 */
    tmp14 += z1;
    tmp15 += z1 + MULTIPLY(z3, FIX(0.384515595)) -   /* c3-c7 */
             MULTIPLY(z4, FIX(1.742345811));         /* c1+c11 */

    /* Final output stage */

    outptr[0]  = range_limit[(int)RIGHT_SHIFT(tmp20 + tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[12] = range_limit[(int)RIGHT_SHIFT(tmp20 - tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[1]  = range_limit[(int)RIGHT_SHIFT(tmp21 + tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[11] = range_limit[(int)RIGHT_SHIFT(tmp21 - tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[2]  = range_limit[(int)RIGHT_SHIFT(tmp22 + tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[10] = range_limit[(int)RIGHT_SHIFT(tmp22 - tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[3]  = range_limit[(int)RIGHT_SHIFT(tmp23 + tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[9]  = range_limit[(int)RIGHT_SHIFT(tmp23 - tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[4]  = range_limit[(int)RIGHT_SHIFT(tmp24 + tmp14,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[8]  = range_limit[(int)RIGHT_SHIFT(tmp24 - tmp14,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[5]  = range_limit[(int)RIGHT_SHIFT(tmp25 + tmp15,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[7]  = range_limit[(int)RIGHT_SHIFT(tmp25 - tmp15,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[6]  = range_limit[(int)RIGHT_SHIFT(tmp26,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];

    wsptr += 8;         /* advance pointer to next row */
  }
}